

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

DescriptorNames __thiscall
google::protobuf::anon_unknown_24::
FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
::AllocatePlaceholderNames
          (FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           *this,string_view full_name,size_t name_size)

{
  initializer_list<unsigned_long> sizes;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> bytes;
  bool bVar1;
  DescriptorNames *pDVar2;
  optional<google::protobuf::internal::DescriptorNames> oVar3;
  string_view local_c0;
  string_view local_b0;
  _Storage<google::protobuf::internal::DescriptorNames,_true> local_a0;
  undefined1 local_98;
  size_t local_90;
  size_type local_88;
  iterator local_80;
  undefined8 local_78;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  size_t local_60;
  char *local_58;
  iterator local_50;
  size_type local_48;
  _Storage<google::protobuf::internal::DescriptorNames,_true> local_40;
  optional<google::protobuf::internal::DescriptorNames> out;
  size_t name_size_local;
  FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  *this_local;
  string_view full_name_local;
  
  local_70._M_str = full_name._M_str;
  local_70._M_len = full_name._M_len;
  local_60 = 1;
  local_58 = "";
  local_50 = &local_70;
  local_48 = 2;
  local_90 = name_size;
  out.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>._M_payload.
  super__Optional_payload_base<google::protobuf::internal::DescriptorNames>._8_8_ = name_size;
  this_local = (FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                *)local_70._M_len;
  full_name_local._M_len = (size_t)local_70._M_str;
  local_88 = std::basic_string_view<char,_std::char_traits<char>_>::size
                       ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  local_80 = &local_90;
  local_78 = 2;
  bytes._M_len = local_48;
  bytes._M_array = local_50;
  sizes._M_len = 2;
  sizes._M_array = local_80;
  oVar3 = CreateDescriptorNames(this,bytes,sizes);
  local_40 = oVar3.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
             _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
             _M_payload;
  out.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>._M_payload.
  super__Optional_payload_base<google::protobuf::internal::DescriptorNames>._M_payload._0_1_ =
       oVar3.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
       _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
       _M_engaged;
  bVar1 = std::optional<google::protobuf::internal::DescriptorNames>::has_value
                    ((optional<google::protobuf::internal::DescriptorNames> *)&local_40._M_value);
  if (bVar1) {
    pDVar2 = std::optional<google::protobuf::internal::DescriptorNames>::operator*
                       ((optional<google::protobuf::internal::DescriptorNames> *)&local_40._M_value)
    ;
    full_name_local._M_str = pDVar2->payload_;
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b0,"");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c0,"unknown");
    oVar3 = AllocateEntityNames(this,local_b0,local_c0);
    local_a0 = oVar3.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
               _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
               _M_payload;
    local_98 = oVar3.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
               _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
               _M_engaged;
    pDVar2 = std::optional<google::protobuf::internal::DescriptorNames>::value
                       ((optional<google::protobuf::internal::DescriptorNames> *)&local_a0._M_value)
    ;
    full_name_local._M_str = pDVar2->payload_;
  }
  return (DescriptorNames)full_name_local._M_str;
}

Assistant:

internal::DescriptorNames AllocatePlaceholderNames(
      absl::string_view full_name, size_t name_size) {
    static constexpr absl::string_view kNullChar("\0", 1);
    auto out = CreateDescriptorNames({full_name, kNullChar},
                                     {name_size, full_name.size()});
    if (out.has_value()) return *out;
    // Return any valid name for the caller to use and keep going.
    return AllocateEntityNames("", "unknown").value();
  }